

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O2

void __thiscall
cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::remove_variable
          (BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse> *this,uint *v)

{
  _delete_label(this,*v,true);
  return;
}

Assistant:

void remove_variable( const IndexType &v ) {
      _delete_label( v );
    }